

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void log_option(nh_option_desc *opt)

{
  int iVar1;
  boolean bVar2;
  size_t sVar3;
  uchar *puVar4;
  long lVar5;
  char *pcVar6;
  __off_t _Var7;
  char encbuf [512];
  char acStack_228 [512];
  
  if (iflags.disable_log != '\0') {
    return;
  }
  if (logfile == -1) {
    return;
  }
  puVar4 = (uchar *)opt->name;
  sVar3 = strlen((char *)puVar4);
  base64_encode_binary(puVar4,acStack_228,(int)sVar3);
  lprintf("\n!%s:");
  switch(opt->type) {
  case OPTTYPE_BOOL:
    pcVar6 = "b:%x";
    break;
  case OPTTYPE_INT:
    pcVar6 = "i:%d";
    break;
  case OPTTYPE_ENUM:
    pcVar6 = "e:%x";
    break;
  case OPTTYPE_STRING:
    puVar4 = "";
    if ((uchar *)(opt->value).s != (uchar *)0x0) {
      puVar4 = (uchar *)(opt->value).s;
    }
    sVar3 = strlen((char *)puVar4);
    base64_encode_binary(puVar4,acStack_228,(int)sVar3);
    lprintf("s:%s");
    goto switchD_001b7218_default;
  case OPTTYPE_AUTOPICKUP_RULES:
    puVar4 = (uchar *)autopickup_to_string((opt->value).ar);
    lprintf("a:");
    sVar3 = strlen((char *)puVar4);
    lVar5 = compressBound((long)(int)sVar3);
    pcVar6 = (char *)malloc((long)((int)((ulong)(lVar5 << 2) / 3) + 0x10));
    sVar3 = strlen((char *)puVar4);
    base64_encode_binary(puVar4,pcVar6,(int)sVar3);
    iVar1 = logfile;
    sVar3 = strlen(pcVar6);
    bVar2 = write_full(iVar1,pcVar6,sVar3);
    if (bVar2 == '\0') {
      pcVar6 = "log_option: failed to write autopickup_rules";
LAB_001b73a5:
      panic(pcVar6);
    }
    goto LAB_001b73ac;
  case OPTTYPE_MSGTYPE:
    puVar4 = (uchar *)msgtype_to_string((opt->value).mt);
    lprintf("m:");
    sVar3 = strlen((char *)puVar4);
    lVar5 = compressBound((long)(int)sVar3);
    pcVar6 = (char *)malloc((long)((int)((ulong)(lVar5 << 2) / 3) + 0x10));
    sVar3 = strlen((char *)puVar4);
    base64_encode_binary(puVar4,pcVar6,(int)sVar3);
    iVar1 = logfile;
    sVar3 = strlen(pcVar6);
    bVar2 = write_full(iVar1,pcVar6,sVar3);
    if (bVar2 == '\0') {
      pcVar6 = "log_option: failed to write msgtype_rules";
      goto LAB_001b73a5;
    }
LAB_001b73ac:
    free(pcVar6);
    free(puVar4);
  default:
    goto switchD_001b7218_default;
  }
  lprintf(pcVar6);
switchD_001b7218_default:
  _Var7 = lseek(logfile,0,1);
  last_cmd_pos = (uint)_Var7;
  return;
}

Assistant:

void log_option(struct nh_option_desc *opt)
{
    char encbuf[ENCBUFSZ];
    char *str, *encbuf2;
    
    if (iflags.disable_log || logfile == -1)
	return;
    
    base64_encode(opt->name, encbuf);
    lprintf("\n!%s:", encbuf);
    
    switch (opt->type) {
	case OPTTYPE_STRING:
	    str = opt->value.s ? opt->value.s : "";
	    base64_encode(str, encbuf);
	    lprintf("s:%s", encbuf);
	    break;
	    
	case OPTTYPE_ENUM:
	    lprintf("e:%x", opt->value.e);
	    break;
	    
	case OPTTYPE_INT:
	    lprintf("i:%d", opt->value.i);
	    break;
	    
	case OPTTYPE_BOOL:
	    lprintf("b:%x", !!opt->value.b);
	    break;
	
	case OPTTYPE_AUTOPICKUP_RULES:
	    str = autopickup_to_string(opt->value.ar);
	    lprintf("a:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules might overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write autopickup_rules");
	    free(encbuf2);
	    free(str);
	    break;
	    
	case OPTTYPE_MSGTYPE:
	    str = msgtype_to_string(opt->value.mt);
	    lprintf("m:");
	    encbuf2 = malloc(base64size(strlen(str)));
	    base64_encode(str, encbuf2);
	    /* write directly, large numbers of rules may overflow outbuf in lprintf */
	    if (!write_full(logfile, encbuf2, strlen(encbuf2)))
		panic("log_option: failed to write msgtype_rules");
	    free(encbuf2);
	    free(str);
	    break;
    }
    
    last_cmd_pos = lseek(logfile, 0, SEEK_CUR);
}